

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

float nk_font_text_width(nk_handle handle,float height,char *text,int len)

{
  nk_rune nVar1;
  nk_font_glyph *pnVar2;
  int in_EDX;
  long in_RSI;
  nk_rune *in_RDI;
  float in_XMM0_Da;
  float fVar3;
  nk_font_glyph *g;
  nk_font *font;
  float scale;
  int glyph_len;
  float text_width;
  int text_len;
  nk_rune unicode;
  undefined8 in_stack_ffffffffffffffb8;
  float local_30;
  nk_rune unicode_00;
  int in_stack_ffffffffffffffd8;
  float local_4;
  
  local_30 = 0.0;
  if (((in_RDI == (nk_rune *)0x0) || (in_RSI == 0)) || (in_EDX == 0)) {
    local_4 = 0.0;
  }
  else {
    fVar3 = in_XMM0_Da / (float)in_RDI[0xc];
    nVar1 = nk_utf_decode((char *)(ulong)(uint)fVar3,in_RDI,
                          (int)((ulong)in_stack_ffffffffffffffb8 >> 0x20));
    unicode_00 = nVar1;
    if (nVar1 == 0) {
      local_4 = 0.0;
    }
    else {
      while (((int)unicode_00 <= in_EDX && nVar1 != 0 && (in_stack_ffffffffffffffd8 != 0xfffd))) {
        pnVar2 = nk_font_find_glyph((nk_font *)CONCAT44(in_EDX,in_stack_ffffffffffffffd8),unicode_00
                                   );
        local_30 = pnVar2->xadvance * fVar3 + local_30;
        nVar1 = nk_utf_decode((char *)CONCAT44(nVar1,fVar3),in_RDI,(int)((ulong)pnVar2 >> 0x20));
        unicode_00 = nVar1 + unicode_00;
      }
      local_4 = local_30;
    }
  }
  return local_4;
}

Assistant:

NK_INTERN float
nk_font_text_width(nk_handle handle, float height, const char *text, int len)
{
nk_rune unicode;
int text_len  = 0;
float text_width = 0;
int glyph_len = 0;
float scale = 0;

struct nk_font *font = (struct nk_font*)handle.ptr;
NK_ASSERT(font);
NK_ASSERT(font->glyphs);
if (!font || !text || !len)
return 0;

scale = height/font->info.height;
glyph_len = text_len = nk_utf_decode(text, &unicode, (int)len);
if (!glyph_len) return 0;
while (text_len <= (int)len && glyph_len) {
const struct nk_font_glyph *g;
if (unicode == NK_UTF_INVALID) break;

/* query currently drawn glyph information */
g = nk_font_find_glyph(font, unicode);
text_width += g->xadvance * scale;

/* offset next glyph */
glyph_len = nk_utf_decode(text + text_len, &unicode, (int)len - text_len);
text_len += glyph_len;
}
return text_width;
}